

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

HighsHashTable<int,_int> * __thiscall
HighsHashTable<int,_int>::operator=
          (HighsHashTable<int,_int> *this,HighsHashTable<int,_int> *param_1)

{
  u64 uVar1;
  
  std::__uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>::
  operator=((__uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
             *)this,(__uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                     *)param_1);
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::operator=
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
             &this->metadata,
             (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
             &param_1->metadata);
  uVar1 = param_1->numHashShift;
  this->tableSizeMask = param_1->tableSizeMask;
  this->numHashShift = uVar1;
  this->numElements = param_1->numElements;
  return this;
}

Assistant:

HighsHashTable<K, V>& operator=(HighsHashTable<K, V>&&) = default;